

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::basic_substring<const_char>::ends_with(basic_substring<const_char> *this,ro_substr pattern)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  error_flags eVar4;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t s;
  size_t i;
  ulong local_48;
  long local_38;
  ulong local_30;
  bool local_21;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  if ((ulong)in_RDI[1] < in_RDX) {
    local_21 = false;
  }
  else {
    local_48 = 0;
    lVar2 = in_RDI[1];
    local_38 = in_RSI;
    local_30 = in_RDX;
    for (; local_48 < local_30; local_48 = local_48 + 1) {
      cVar1 = *(char *)(*in_RDI + (lVar2 - in_RDX) + local_48);
      local_8 = &local_38;
      local_10 = local_48;
      if (local_30 <= local_48) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        local_20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_18 = 0x14c3;
        handle_error(0x34984b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (cVar1 != *(char *)(local_38 + local_10)) {
        return false;
      }
    }
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool ends_with(ro_substr pattern) const
    {
        if(len < pattern.len)
        {
            return false;
        }
        for(size_t i = 0, s = len-pattern.len; i < pattern.len; ++i)
        {
            if(str[s+i] != pattern[i])
            {
                return false;
            }
        }
        return true;
    }